

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,str_writer<wchar_t> *f)

{
  size_t sVar1;
  type pwVar2;
  wchar_t *pwVar3;
  ulong n;
  ulong uVar4;
  char_type fill;
  wchar_t local_2c;
  
  n = (ulong)spec->width_;
  sVar1 = f->size_;
  uVar4 = n - sVar1;
  if (n < sVar1 || uVar4 == 0) {
    pwVar2 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,
                        sVar1);
    if (f->size_ != 0) {
      memmove(pwVar2,f->s,f->size_ << 2);
      return;
    }
  }
  else {
    pwVar2 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,n);
    local_2c = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      pwVar3 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar2,uVar4 >> 1,&local_2c);
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(pwVar3,f->s,sVar1 * 4);
      }
      pwVar2 = pwVar3 + sVar1;
      uVar4 = uVar4 - (uVar4 >> 1);
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pwVar3 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar2,uVar4,&local_2c);
        if (f->size_ == 0) {
          return;
        }
        memmove(pwVar3,f->s,f->size_ << 2);
        return;
      }
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(pwVar2,f->s,sVar1 * 4);
      }
      pwVar2 = pwVar2 + sVar1;
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar2,uVar4,&local_2c);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }